

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SliceStaticLayerParams::ByteSizeLong(SliceStaticLayerParams *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  
  sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(&this->beginids_);
  if (sVar2 == 0) {
    iVar5 = 0;
    lVar4 = 0;
  }
  else {
    iVar5 = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    lVar4 = sVar3 + 1;
  }
  this->_beginids_cached_byte_size_ = iVar5;
  lVar4 = lVar4 + sVar2;
  uVar1 = (this->beginmasks_).current_size_;
  if ((ulong)uVar1 != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(uVar1);
    lVar4 = lVar4 + sVar2 + 1;
  }
  this->_beginmasks_cached_byte_size_ = uVar1;
  lVar4 = lVar4 + (ulong)uVar1;
  sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(&this->endids_);
  if (sVar2 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    lVar4 = lVar4 + sVar3 + 1;
  }
  this->_endids_cached_byte_size_ = iVar5;
  lVar4 = lVar4 + sVar2;
  uVar1 = (this->endmasks_).current_size_;
  if ((ulong)uVar1 != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(uVar1);
    lVar4 = lVar4 + sVar2 + 1;
  }
  this->_endmasks_cached_byte_size_ = uVar1;
  lVar4 = lVar4 + (ulong)uVar1;
  sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(&this->strides_);
  if (sVar2 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    lVar4 = lVar4 + sVar3 + 1;
  }
  this->_strides_cached_byte_size_ = iVar5;
  lVar4 = lVar4 + sVar2;
  uVar1 = (this->squeezemasks_).current_size_;
  if ((ulong)uVar1 != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(uVar1);
    lVar4 = lVar4 + sVar2 + 1;
  }
  this->_squeezemasks_cached_byte_size_ = uVar1;
  sVar2 = lVar4 + (ulong)uVar1;
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t SliceStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SliceStaticLayerParams)
  size_t total_size = 0;

  // repeated int64 beginIds = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->beginids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool beginMasks = 2;
  {
    unsigned int count = this->beginmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 endIds = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->endids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool endMasks = 4;
  {
    unsigned int count = this->endmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 strides = 5;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->strides_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _strides_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool squeezeMasks = 6;
  {
    unsigned int count = this->squeezemasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _squeezemasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}